

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsMoved
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destination)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QModelIndex *in_stack_ffffffffffffff90;
  LayoutChangeHint hint;
  QList<QPersistentModelIndex> *sourceParents;
  QConcatenateTablesProxyModelPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(in_stack_ffffffffffffff90);
  if ((!bVar2) && (bVar2 = QModelIndex::isValid(in_stack_ffffffffffffff90), !bVar2)) {
    hint = NoLayoutChangeHint;
    sourceParents = (QList<QPersistentModelIndex> *)0x0;
    this_00 = (QConcatenateTablesProxyModelPrivate *)0x0;
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x859e5c);
    slotSourceLayoutChanged(this_00,sourceParents,hint);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x859e7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsMoved(const QModelIndex &sourceParent,
                                                           int sourceStart, int sourceEnd,
                                                           const QModelIndex &destinationParent,
                                                           int destination)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(destination)
    if (sourceParent.isValid() || destinationParent.isValid())
        return;
    slotSourceLayoutChanged({}, QAbstractItemModel::HorizontalSortHint);
}